

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

int wwCmp2(word *a,size_t n,word *b,size_t m)

{
  bool_t bVar1;
  uint uVar2;
  ulong in_RCX;
  word *in_RDX;
  ulong in_RSI;
  word *in_RDI;
  int z_1;
  int z;
  int ret;
  uint local_24;
  
  if (in_RCX < in_RSI) {
    bVar1 = wwIsZero(in_RDI + in_RCX,in_RSI - in_RCX);
    uVar2 = wwCmp(in_RDI,in_RDX,in_RCX);
    local_24 = -bVar1 & uVar2 | bVar1 - 1U & 1;
  }
  else if (in_RSI < in_RCX) {
    bVar1 = wwIsZero(in_RDX + in_RSI,in_RCX - in_RSI);
    uVar2 = wwCmp(in_RDI,in_RDX,in_RSI);
    local_24 = -bVar1 & uVar2 | bVar1 - 1U;
  }
  else {
    local_24 = wwCmp(in_RDI,in_RDX,in_RSI);
  }
  return local_24;
}

Assistant:

int SAFE(wwCmp2)(const word a[], size_t n, const word b[], size_t m)
{
	register int ret;
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	if (n > m)
	{
		register int z = wwIsZero(a + m, n - m);
		ret = wwCmp(a, b, m);
		ret = -z & ret | (z - 1) & 1;
		z = 0;
	}
	else if (n < m)
	{
		register int z = wwIsZero(b + n, m - n);
		ret = wwCmp(a, b, n);
		ret = -z & ret | (z - 1) & -1;
		z = 0;
	}
	else
		ret = wwCmp(a, b, n);
	return ret;
}